

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int * nifti_get_intlist(int nvals,char *str)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ushort *puVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  char *__format;
  int iVar14;
  int iVar15;
  char *pcVar16;
  size_t __size;
  bool bVar17;
  char *cpt;
  int *local_88;
  uint local_78 [2];
  ushort **local_70;
  int local_68;
  int local_64;
  char *local_60;
  ulong local_58;
  long local_50;
  char *local_48;
  size_t local_40;
  int local_34;
  
  if (str == (char *)0x0 || nvals < 1) {
    return (int *)0x0;
  }
  cVar1 = *str;
  if (cVar1 != '\0') {
    local_88 = (int *)malloc(8);
    if (local_88 == (int *)0x0) {
      nifti_get_intlist_cold_3();
    }
    else {
      *local_88 = 0;
      bVar17 = (cVar1 + 0xa5U & 0xdf) == 0;
      uVar13 = (ulong)bVar17;
      if (1 < g_opts_0) {
        fprintf(_stderr,"-d making int_list (vals = %d) from \'%s\'\n",(ulong)(uint)nvals,str);
      }
      local_40 = strlen(str);
      iVar8 = 0;
      if ((int)(uint)bVar17 < (int)local_40) {
        uVar3 = nvals - 1;
        local_50 = 1 - (long)str;
        local_48 = str + -1;
        iVar8 = 0;
        local_60 = str;
        local_58 = (ulong)(uint)nvals;
        while( true ) {
          uVar13 = (ulong)(int)uVar13;
          cVar1 = str[uVar13];
          if (((cVar1 == '\0') || (cVar1 == ']')) || (cVar1 == '}')) break;
          local_70 = __ctype_b_loc();
          puVar6 = *local_70;
          lVar11 = 1 - uVar13;
          do {
            bVar2 = str[uVar13];
            uVar13 = uVar13 + 1;
            lVar11 = lVar11 + -1;
          } while ((*(byte *)((long)puVar6 + (long)(char)bVar2 * 2 + 1) & 0x20) != 0);
          if (0x5c < bVar2) {
            if ((bVar2 != 0x5d) && (bVar2 != 0x7d)) {
LAB_001124fd:
              pcVar16 = str + -lVar11;
              uVar5 = strtol(pcVar16,(char **)local_78,10);
              iVar4 = (int)uVar5;
              if ((iVar4 < 0) || ((int)local_58 <= iVar4)) {
                pcVar16 = "** ERROR: list index %d is out of range 0..%d\n";
LAB_001128de:
                fprintf(_stderr,pcVar16,uVar5 & 0xffffffff,(ulong)uVar3);
              }
              else {
                uVar13 = ((ulong)local_78[0] + local_50) - uVar13;
                if ((iVar4 != 0) || ((uVar13 & 0xffffffff) != 0)) {
                  uVar13 = uVar13 - lVar11;
                  puVar6 = *local_70;
                  goto LAB_0011255a;
                }
                __format = "** ERROR: list syntax error \'%s\'\n";
LAB_0011290a:
                fprintf(_stderr,__format,pcVar16);
              }
              goto LAB_00112812;
            }
            break;
          }
          if (bVar2 != 0x24) {
            if (bVar2 != 0) goto LAB_001124fd;
            break;
          }
          uVar5 = (ulong)uVar3;
LAB_0011255a:
          pcVar16 = local_48 + (int)uVar13;
          lVar11 = (uVar13 << 0x20) + -0x100000000;
          do {
            lVar11 = lVar11 + 0x100000000;
            bVar2 = pcVar16[1];
            pcVar16 = pcVar16 + 1;
            uVar12 = (int)uVar13 + 1;
            uVar13 = (ulong)uVar12;
          } while ((*(byte *)((long)puVar6 + (long)(char)bVar2 * 2 + 1) & 0x20) != 0);
          iVar4 = (int)uVar5;
          if (0x2d < bVar2) {
            if (bVar2 == 0x2e) {
              iVar9 = 2;
              if (str[(lVar11 >> 0x20) + 1] == '.') goto LAB_00112634;
            }
            else if ((bVar2 == 0x7d) || (bVar2 == 0x5d)) goto LAB_001125cb;
LAB_001128b7:
            __format = "** ERROR: index list syntax is bad: \'%s\'\n";
            goto LAB_0011290a;
          }
          if ((bVar2 == 0) || (bVar2 == 0x2c)) {
LAB_001125cb:
            local_88 = (int *)realloc(local_88,(long)iVar8 * 4 + 8);
            if (local_88 == (int *)0x0) {
LAB_0011286d:
              fprintf(_stderr,"** nifti_get_intlist: failed realloc of %d ints\n",(ulong)(iVar8 + 2)
                     );
              return (int *)0x0;
            }
            iVar8 = iVar8 + 1;
            *local_88 = iVar8;
            local_88[iVar8] = iVar4;
            cVar1 = *pcVar16;
            if (((cVar1 == '\0') || (cVar1 == ']')) || (cVar1 == '}')) break;
          }
          else {
            iVar9 = 1;
            if (bVar2 != 0x2d) goto LAB_001128b7;
LAB_00112634:
            iVar15 = iVar9 + uVar12 + -1;
            local_68 = iVar8;
            if (str[iVar15] == '$') {
              iVar9 = iVar9 + uVar12;
              uVar13 = (ulong)uVar3;
            }
            else {
              pcVar16 = str + iVar15;
              uVar13 = strtol(pcVar16,(char **)local_78,10);
              iVar8 = (int)uVar13;
              if ((iVar8 < 0) || ((int)local_58 <= iVar8)) {
                pcVar16 = "** ERROR: index %d is out of range 0..%d\n";
                uVar5 = uVar13;
                goto LAB_001128de;
              }
              iVar9 = local_78[0] - (int)pcVar16;
              if (iVar8 == 0 && iVar9 == 0) {
                __format = "** ERROR: index list syntax error \'%s\'\n";
                goto LAB_0011290a;
              }
              iVar9 = iVar15 + iVar9;
              puVar6 = *local_70;
            }
            str = local_60;
            iVar8 = local_68;
            iVar15 = (int)uVar13;
            pcVar16 = local_60 + iVar9;
            do {
              iVar10 = iVar9;
              cVar1 = *pcVar16;
              iVar9 = iVar10 + 1;
              pcVar16 = pcVar16 + 1;
            } while ((*(byte *)((long)puVar6 + (long)cVar1 * 2 + 1) & 0x20) != 0);
            if (cVar1 == '(') {
              pcVar16 = local_60 + iVar9;
              uVar7 = strtol(pcVar16,(char **)local_78,10);
              iVar14 = (int)uVar7;
              if (iVar14 == 0) {
                nifti_get_intlist_cold_1();
                return (int *)0x0;
              }
              iVar9 = iVar9 + (local_78[0] - (int)pcVar16);
              iVar10 = iVar9 + (uint)(str[iVar9] == ')');
              if ((iVar4 - iVar15) * iVar14 < 1) {
LAB_0011275a:
                __size = (long)iVar8 * 4 + 8;
                iVar4 = (iVar4 - iVar15) * iVar14;
                local_64 = iVar14 * iVar14;
                do {
                  local_88 = (int *)realloc(local_88,__size);
                  if (local_88 == (int *)0x0) goto LAB_0011286d;
                  iVar8 = iVar8 + 1;
                  *local_88 = iVar8;
                  *(int *)((long)local_88 + (__size - 4)) = (int)uVar5;
                  uVar5 = (ulong)(uint)((int)uVar5 + iVar14);
                  __size = __size + 4;
                  iVar4 = iVar4 + local_64;
                  str = local_60;
                } while (iVar4 < 1);
              }
              else {
                fprintf(_stderr,"** WARNING: index list \'%d..%d(%d)\' means nothing\n",
                        uVar5 & 0xffffffff,uVar13 & 0xffffffff,uVar7 & 0xffffffff);
              }
            }
            else {
              iVar14 = (uint)(iVar4 - iVar15 == 0 || iVar4 < iVar15) * 2 + -1;
              if ((iVar4 - iVar15) * iVar14 < 1) goto LAB_0011275a;
            }
            iVar4 = iVar10 + -1;
            pcVar16 = str + iVar10;
            do {
              cVar1 = *pcVar16;
              iVar4 = iVar4 + 1;
              pcVar16 = pcVar16 + 1;
            } while ((*(byte *)((long)*local_70 + (long)cVar1 * 2 + 1) & 0x20) != 0);
            uVar13 = (ulong)((uint)(cVar1 == ',') + iVar4);
          }
          if ((int)local_40 <= (int)uVar13) break;
        }
        iVar8 = *local_88;
      }
      if (1 < g_opts_0) {
        nifti_get_intlist_cold_2();
        iVar8 = local_34;
      }
      if (iVar8 != 0) {
        return local_88;
      }
LAB_00112812:
      free(local_88);
    }
  }
  return (int *)0x0;
}

Assistant:

int * nifti_get_intlist( int nvals , const char * str )
{
   int *subv = NULL ;
   int ii , ipos , nout , slen ;
   int ibot,itop,istep , nused ;
   char *cpt ;

   /* Meaningless input? */
   if( nvals < 1 ) return NULL ;

   /* No selection list? */
   if( str == NULL || str[0] == '\0' ) return NULL ;

   /* skip initial '[' or '{' */
   subv = (int *)malloc( sizeof(int) * 2 ) ;
   if( !subv ) {
      fprintf(stderr,"** nifti_get_intlist: failed alloc of 2 ints\n");
      return NULL;
   }
   subv[0] = nout = 0 ;

   ipos = 0 ;
   if( str[ipos] == '[' || str[ipos] == '{' ) ipos++ ;

   if( g_opts.debug > 1 )
      fprintf(stderr,"-d making int_list (vals = %d) from '%s'\n", nvals, str);

   /**- for each sub-selector until end of input... */

   slen = (int)strlen(str) ;
   while( ipos < slen && !ISEND(str[ipos]) ){

     while( isspace((int) str[ipos]) ) ipos++ ;   /* skip blanks */
      if( ISEND(str[ipos]) ) break ;         /* done */

      /**- get starting value */

      if( str[ipos] == '$' ){  /* special case */
         ibot = nvals-1 ; ipos++ ;
      } else {                 /* decode an integer */
         ibot = strtol( str+ipos , &cpt , 10 ) ;
         if( ibot < 0 ){
           fprintf(stderr,"** ERROR: list index %d is out of range 0..%d\n",
                   ibot,nvals-1) ;
           free(subv) ; return NULL ;
         }
         if( ibot >= nvals ){
           fprintf(stderr,"** ERROR: list index %d is out of range 0..%d\n",
                   ibot,nvals-1) ;
           free(subv) ; return NULL ;
         }
         nused = (cpt-(str+ipos)) ;
         if( ibot == 0 && nused == 0 ){
           fprintf(stderr,"** ERROR: list syntax error '%s'\n",str+ipos) ;
           free(subv) ; return NULL ;
         }
         ipos += nused ;
      }

      while( isspace((int) str[ipos]) ) ipos++ ;   /* skip blanks */

      /**- if that's it for this sub-selector, add one value to list */

      if( str[ipos] == ',' || ISEND(str[ipos]) ){
         nout++ ;
         subv = (int *)realloc( (char *)subv , sizeof(int) * (nout+1) ) ;
         if( !subv ) {
            fprintf(stderr,"** nifti_get_intlist: failed realloc of %d ints\n",
                    nout+1);
            return NULL;
         }
         subv[0]    = nout ;
         subv[nout] = ibot ;
         if( ISEND(str[ipos]) ) break ; /* done */
         ipos++ ; continue ;            /* re-start loop at next sub-selector */
      }

      /**- otherwise, must have '..' or '-' as next inputs */

      if( str[ipos] == '-' ){
         ipos++ ;
      } else if( str[ipos] == '.' && str[ipos+1] == '.' ){
         ipos++ ; ipos++ ;
      } else {
         fprintf(stderr,"** ERROR: index list syntax is bad: '%s'\n",
                 str+ipos) ;
         free(subv) ; return NULL ;
      }

      /**- get ending value for loop now */

      if( str[ipos] == '$' ){  /* special case */
         itop = nvals-1 ; ipos++ ;
      } else {                 /* decode an integer */
         itop = strtol( str+ipos , &cpt , 10 ) ;
         if( itop < 0 ){
           fprintf(stderr,"** ERROR: index %d is out of range 0..%d\n",
                   itop,nvals-1) ;
           free(subv) ; return NULL ;
         }
         if( itop >= nvals ){
           fprintf(stderr,"** ERROR: index %d is out of range 0..%d\n",
                   itop,nvals-1) ;
           free(subv) ; return NULL ;
         }
         nused = (cpt-(str+ipos)) ;
         if( itop == 0 && nused == 0 ){
           fprintf(stderr,"** ERROR: index list syntax error '%s'\n",str+ipos) ;
           free(subv) ; return NULL ;
         }
         ipos += nused ;
      }

      /**- set default loop step */

      istep = (ibot <= itop) ? 1 : -1 ;

      while( isspace((int) str[ipos]) ) ipos++ ;            /* skip blanks */

      /**- check if we have a non-default loop step */

      if( str[ipos] == '(' ){  /* decode an integer */
         ipos++ ;
         istep = strtol( str+ipos , &cpt , 10 ) ;
         if( istep == 0 ){
           fprintf(stderr,"** ERROR: index loop step is 0!\n") ;
           free(subv) ; return NULL ;
         }
         nused = (cpt-(str+ipos)) ;
         ipos += nused ;
         if( str[ipos] == ')' ) ipos++ ;
         if( (ibot-itop)*istep > 0 ){
           fprintf(stderr,"** WARNING: index list '%d..%d(%d)' means nothing\n",
                   ibot,itop,istep ) ;
         }
      }

      /**- add values to output */

      for( ii=ibot ; (ii-itop)*istep <= 0 ; ii += istep ){
         nout++ ;
         subv = (int *)realloc( (char *)subv , sizeof(int) * (nout+1) ) ;
         if( !subv ) {
            fprintf(stderr,"** nifti_get_intlist: failed realloc of %d ints\n",
                    nout+1);
            return NULL;
         }
         subv[0]    = nout ;
         subv[nout] = ii ;
      }

      /**- check if we have a comma to skip over */

      while( isspace((int) str[ipos]) ) ipos++ ;            /* skip blanks */
      if( str[ipos] == ',' ) ipos++ ;                       /* skip commas */

   }  /* end of loop through selector string */

   if( g_opts.debug > 1 ) {
      fprintf(stderr,"+d int_list (vals = %d): ", subv[0]);
      for( ii = 1; ii <= subv[0]; ii++ ) fprintf(stderr,"%d ", subv[ii]);
      fputc('\n',stderr);
   }

   if( subv[0] == 0 ){ free(subv); subv = NULL; }
   return subv ;
}